

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it
          )

{
  int iVar1;
  ulong uVar2;
  wchar_t *pwVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  wchar_t wVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  wchar_t wVar12;
  ulong uVar13;
  ulong uVar14;
  wchar_t *pwVar15;
  size_t sVar16;
  wchar_t local_68 [12];
  char_type buffer [13];
  
  pwVar3 = (it->super_truncating_iterator_base<wchar_t_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<wchar_t_*>).limit_;
  sVar4 = (it->super_truncating_iterator_base<wchar_t_*>).count_;
  wVar7 = it->blackhole_;
  uVar10 = *(uint *)this;
  uVar13 = (ulong)uVar10;
  iVar1 = *(int *)(this + 4);
  lVar8 = (long)iVar1;
  pwVar15 = local_68 + lVar8;
  if (uVar13 < 100) {
    if (uVar10 < 10) goto LAB_002039d9;
    uVar14 = uVar13 * 2;
    local_68[lVar8 + -1] = (int)(char)internal::basic_data<void>::DIGITS[uVar13 * 2 + 1];
LAB_002039f3:
    pwVar15 = pwVar15 + -1;
  }
  else {
    iVar5 = 0;
    do {
      uVar14 = uVar13;
      uVar9 = (uint)uVar14;
      uVar10 = (uint)(uVar14 / 100);
      iVar11 = (int)(uVar14 / 100);
      uVar13 = (ulong)((uVar9 + iVar11 * -100) * 2);
      pwVar15[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar13 + 1];
      if (iVar5 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        pwVar15[-2] = *(wchar_t *)(this + 8);
        pwVar15[-3] = (int)(char)internal::basic_data<void>::DIGITS[uVar13];
        if ((uint)((iVar5 + 2) * -0x55555555) < 0x55555556) {
          lVar6 = -0x10;
          goto LAB_00203984;
        }
        pwVar15 = pwVar15 + -3;
      }
      else {
        pwVar15[-2] = (int)(char)internal::basic_data<void>::DIGITS[uVar13];
        if ((uint)((iVar5 + 2) * -0x55555555) < 0x55555556) {
          lVar6 = -0xc;
LAB_00203984:
          *(undefined4 *)((long)pwVar15 + lVar6) = *(undefined4 *)(this + 8);
          pwVar15 = (wchar_t *)((long)pwVar15 + lVar6);
        }
        else {
          pwVar15 = pwVar15 + -2;
        }
      }
      iVar5 = iVar5 + 2;
      uVar13 = uVar14 / 100;
    } while (9999 < uVar9);
    if (uVar9 < 1000) {
LAB_002039d9:
      wVar12 = uVar10 | 0x30;
      goto LAB_00203a06;
    }
    uVar14 = (ulong)(uint)(iVar11 + (int)(uVar14 / 100));
    pwVar15[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar14 + 1];
    if (0x55555555 < iVar5 * -0x55555555 + 0xaaaaaaabU) goto LAB_002039f3;
    pwVar15[-2] = *(wchar_t *)(this + 8);
    pwVar15 = pwVar15 + -2;
  }
  wVar12 = (wchar_t)(char)internal::basic_data<void>::DIGITS[uVar14 & 0xffffffff];
LAB_00203a06:
  pwVar15[-1] = wVar12;
  if (0 < iVar1) {
    lVar6 = lVar8 + 1;
    pwVar15 = local_68;
    sVar16 = sVar4;
    do {
      wVar12 = *pwVar15;
      if (sVar16 < uVar2) {
        *pwVar3 = *pwVar15;
        pwVar3 = pwVar3 + 1;
        wVar12 = wVar7;
      }
      wVar7 = wVar12;
      sVar16 = sVar16 + 1;
      pwVar15 = pwVar15 + 1;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
    sVar4 = sVar4 + lVar8;
  }
  (it->super_truncating_iterator_base<wchar_t_*>).out_ = pwVar3;
  (it->super_truncating_iterator_base<wchar_t_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<wchar_t_*>).count_ = sVar4;
  it->blackhole_ = wVar7;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }